

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hanabi_state.cc
# Opt level: O1

pair<bool,_bool> __thiscall
hanabi_learning_env::HanabiState::AddToFireworks(HanabiState *this,HanabiCard card)

{
  pointer piVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  
  uVar5 = card.color_;
  if ((((int)uVar5 < 0) || (this->parent_game_->num_colors_ <= (int)uVar5)) ||
     ((this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar5 & 0x7fffffff] != card.rank_)) {
    if (this->life_tokens_ < 1) {
      __assert_fail("life_tokens_ > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jtwwang[P]hanabi/hanabi_lib/hanabi_state.cc"
                    ,0x80,"void hanabi_learning_env::HanabiState::DecrementLifeTokens()");
    }
    this->life_tokens_ = this->life_tokens_ + -1;
    uVar3 = 0;
  }
  else {
    piVar1 = (this->fireworks_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    iVar4 = piVar1[uVar5 & 0x7fffffff] + 1;
    piVar1[uVar5 & 0x7fffffff] = iVar4;
    uVar2 = 1;
    uVar3 = 1;
    if ((iVar4 == this->parent_game_->num_ranks_) &&
       (this->information_tokens_ < this->parent_game_->max_information_tokens_)) {
      this->information_tokens_ = this->information_tokens_ + 1;
      uVar3 = 0x100;
      goto LAB_0010e093;
    }
  }
  uVar2 = uVar3;
  uVar3 = 0;
LAB_0010e093:
  return (pair<bool,_bool>)(uVar3 | uVar2);
}

Assistant:

bool HanabiState::CardPlayableOnFireworks(int color, int rank) const {
  if (color < 0 || color >= ParentGame()->NumColors()) {
    return false;
  }
  return rank == fireworks_[color];
}